

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint_Loop.cc
# Opt level: O2

void __thiscall
RigidBodyDynamics::LoopConstraint::calcConstraintForces
          (LoopConstraint *this,Model *model,double time,VectorNd *Q,VectorNd *QDot,MatrixNd *GSys,
          VectorNd *LagMultSys,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *constraintBodiesUpd,
          vector<RigidBodyDynamics::Math::SpatialTransform,_std::allocator<RigidBodyDynamics::Math::SpatialTransform>_>
          *constraintBodyFramesUpd,
          vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *constraintForcesUpd,
          ConstraintCache *cache,bool resolveAllInRootFrame,bool updateKinematics)

{
  SpatialTransform *this_00;
  ConstraintCache *dst;
  DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *this_01;
  pointer puVar1;
  pointer pSVar2;
  uint i;
  ulong uVar3;
  long lVar4;
  undefined1 local_b8 [16];
  variable_if_dynamic<long,__1> local_a8;
  variable_if_dynamic<long,__1> vStack_a0;
  variable_if_dynamic<long,__1> local_98;
  variable_if_dynamic<long,__1> vStack_90;
  variable_if_dynamic<long,__1> local_88;
  variable_if_dynamic<long,__1> vStack_80;
  double local_78;
  Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false> local_68;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(constraintBodiesUpd,2);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::resize(&constraintBodyFramesUpd->
            super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
           ,2);
  CalcBodyToBaseCoordinates
            ((Vector3d *)local_b8,model,Q,
             *(this->super_Constraint).bodyIds.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start,
             &((this->super_Constraint).bodyFrames.
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start)->r,updateKinematics);
  this_00 = (SpatialTransform *)(cache + 0x470);
  *(long *)(cache + 0x4c8) = local_a8.m_value;
  *(undefined8 *)(cache + 0x4b8) = local_b8._0_8_;
  *(undefined8 *)(cache + 0x4c0) = local_b8._8_8_;
  CalcBodyWorldOrientation
            ((Matrix3d *)local_b8,model,Q,
             *(this->super_Constraint).bodyIds.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start,updateKinematics);
  local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_rows.m_value
       = (long)(this->super_Constraint).bodyFrames.
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start;
  local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_data =
       (PointerType)local_b8;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)this_00,
             (Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
              *)&local_68);
  CalcBodyToBaseCoordinates
            ((Vector3d *)local_b8,model,Q,
             (this->super_Constraint).bodyIds.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[1],
             &(this->super_Constraint).bodyFrames.
              super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
              .
              super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
              ._M_impl.super__Vector_impl_data._M_start[1].r,updateKinematics);
  dst = cache + 0x4d0;
  *(long *)(cache + 0x528) = local_a8.m_value;
  *(undefined8 *)(cache + 0x518) = local_b8._0_8_;
  *(undefined8 *)(cache + 0x520) = local_b8._8_8_;
  CalcBodyWorldOrientation
            ((Matrix3d *)local_b8,model,Q,
             (this->super_Constraint).bodyIds.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[1],updateKinematics);
  local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_rows.m_value
       = (long)((this->super_Constraint).bodyFrames.
                super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                .
                super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                ._M_impl.super__Vector_impl_data._M_start + 1);
  local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_data =
       (PointerType)local_b8;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)dst,
             (Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
              *)&local_68);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::resize
            (&constraintForcesUpd->
              super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,2);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (constraintForcesUpd->
             super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>).
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             ((constraintForcesUpd->
              super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>).
              super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
              _M_impl.super__Vector_impl_data._M_start + 1));
  this_01 = (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)(cache + 0x380);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero(this_01);
  lVar4 = 0;
  for (uVar3 = 0; uVar3 < (this->super_Constraint).sizeOfConstraint; uVar3 = uVar3 + 1) {
    Math::SpatialTransform::apply
              (this_00,(SpatialVector *)(*(long *)&(this->super_Constraint).field_0xd8 + lVar4));
    *(long *)(cache + 0x370) = local_98.m_value;
    *(long *)(cache + 0x378) = vStack_90.m_value;
    *(long *)(cache + 0x360) = local_a8.m_value;
    *(long *)(cache + 0x368) = vStack_a0.m_value;
    *(undefined8 *)(cache + 0x350) = local_b8._0_8_;
    *(undefined8 *)(cache + 0x358) = local_b8._8_8_;
    local_a8.m_value =
         (long)(LagMultSys->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
               m_storage.m_data[(this->super_Constraint).rowInSystem + (int)uVar3];
    local_b8._0_8_ = cache + 0x350;
    Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)this_01,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                *)local_b8);
    lVar4 = lVar4 + 0x30;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(constraintBodiesUpd,2);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::resize(&constraintBodyFramesUpd->
            super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
           ,2);
  if (resolveAllInRootFrame) {
    puVar1 = (constraintBodiesUpd->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start;
    puVar1[0] = 0;
    puVar1[1] = 0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
              (&(((constraintBodyFramesUpd->
                  super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                  ).
                  super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                  ._M_impl.super__Vector_impl_data._M_start)->r).super_Vector3d,
               (Matrix<double,_3,_1,_0,_3,_1> *)(cache + 0x4b8));
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
              (&(constraintBodyFramesUpd->
                super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                ).
                super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                ._M_impl.super__Vector_impl_data._M_start[1].r.super_Vector3d,
               (Matrix<double,_3,_1,_0,_3,_1> *)(cache + 0x518));
    local_b8._0_8_ = this_01;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>>
              (&((constraintForcesUpd->
                 super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>).
                 super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 _M_impl.super__Vector_impl_data._M_start)->super_Matrix<double,_6,_1,_0,_6,_1>,
               (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                *)local_b8);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Matrix<double,6,1,0,6,1>>
              (&(constraintForcesUpd->
                super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>).
                super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start[1].super_Matrix<double,_6,_1,_0,_6,_1>,
               (Matrix<double,_6,_1,_0,_6,_1> *)this_01);
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (constraintBodiesUpd,&(this->super_Constraint).bodyIds);
    std::
    vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
    ::operator=(&constraintBodyFramesUpd->
                 super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                ,&(this->super_Constraint).bodyFrames.
                  super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               );
    vStack_a0.m_value = 3;
    local_98.m_value = 1;
    local_88.m_value = 0;
    vStack_80.m_value = 0;
    local_78 = 2.96439387504748e-323;
    local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_data =
         (PointerType)
         (constraintForcesUpd->
         super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>).
         super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_rows.
    m_value = 3;
    local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_cols.
    m_value = 1;
    local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.m_startRow.
    m_value = 0;
    local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.m_startCol.
    m_value = 0;
    local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.m_outerStride =
         6;
    local_b8._0_8_ = this_00;
    local_a8.m_value = (long)this_01;
    vStack_90.m_value = (long)this_01;
    local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.m_xpr =
         (XprTypeNested)
         local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>
         .super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_data;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,_1,false>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,_1,false>,0>>
              (&local_68,
               (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>
                *)local_b8);
    vStack_a0.m_value = 3;
    local_98.m_value = 1;
    local_88.m_value = 3;
    vStack_80.m_value = 0;
    local_78 = 2.96439387504748e-323;
    local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.m_xpr =
         &((constraintForcesUpd->
           super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>).
           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
           super__Vector_impl_data._M_start)->super_Matrix<double,_6,_1,_0,_6,_1>;
    local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_data =
         (((pointer)
          local_68.
          super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.m_xpr)->
         super_Matrix<double,_6,_1,_0,_6,_1>).
         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array + 3;
    local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_rows.
    m_value = 3;
    local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_cols.
    m_value = 1;
    local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.m_startRow.
    m_value = 3;
    local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.m_startCol.
    m_value = 0;
    local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.m_outerStride =
         6;
    local_b8._0_8_ = this_00;
    local_a8.m_value = (long)(cache + 0x398);
    vStack_90.m_value = (long)this_01;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,_1,false>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,_1,false>,0>>
              (&local_68,
               (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>
                *)local_b8);
    local_a8.m_value = 3;
    vStack_a0.m_value = 1;
    vStack_90.m_value = 0;
    local_88.m_value = 0;
    vStack_80.m_value = 6;
    local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_data =
         (PointerType)
         ((constraintForcesUpd->
          super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>).
          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
          super__Vector_impl_data._M_start + 1);
    local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_rows.
    m_value = 3;
    local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_cols.
    m_value = 1;
    local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.m_startRow.
    m_value = 0;
    local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.m_startCol.
    m_value = 0;
    local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.m_outerStride =
         6;
    local_b8._0_8_ = dst;
    local_b8._8_8_ = this_01;
    local_98.m_value = (long)this_01;
    local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.m_xpr =
         (XprTypeNested)
         local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>
         .super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_data;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,_1,false>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,_1,false>,0>>
              (&local_68,
               (Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>
                *)local_b8);
    local_a8.m_value = 3;
    vStack_a0.m_value = 1;
    vStack_90.m_value = 3;
    local_88.m_value = 0;
    vStack_80.m_value = 6;
    pSVar2 = (constraintForcesUpd->
             super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>).
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start;
    local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.m_xpr =
         &pSVar2[1].super_Matrix<double,_6,_1,_0,_6,_1>;
    local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_data =
         (PointerType)
         ((long)&pSVar2[1].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
    local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_rows.
    m_value = 3;
    local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>.m_cols.
    m_value = 1;
    local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.m_startRow.
    m_value = 3;
    local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.m_startCol.
    m_value = 0;
    local_68.super_BlockImpl<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false,_true>.m_outerStride =
         6;
    local_b8._0_8_ = dst;
    local_b8._8_8_ = cache + 0x398;
    local_98.m_value = (long)this_01;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,_1,false>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,_1,false>,0>>
              (&local_68,
               (Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>,_0>
                *)local_b8);
  }
  return;
}

Assistant:

void LoopConstraint::calcConstraintForces( 
              Model &model,
              const double time,
              const Math::VectorNd &Q,
              const Math::VectorNd &QDot,
              const Math::MatrixNd &GSys,
              const Math::VectorNd &LagMultSys,
              std::vector< unsigned int > &constraintBodiesUpd,
              std::vector< Math::SpatialTransform > &constraintBodyFramesUpd,
              std::vector< Math::SpatialVector > &constraintForcesUpd,
              ConstraintCache &cache,
              bool resolveAllInRootFrame,
              bool updateKinematics)
{
  constraintBodiesUpd.resize(2);
  constraintBodyFramesUpd.resize(2);

  cache.stA.r = CalcBodyToBaseCoordinates(model,Q,bodyIds[0],bodyFrames[0].r,
                                          updateKinematics);
  cache.stA.E = CalcBodyWorldOrientation(model,Q,bodyIds[0],updateKinematics
                                         ).transpose()*bodyFrames[0].E;
  cache.stB.r = CalcBodyToBaseCoordinates(model,Q,bodyIds[1],bodyFrames[1].r,
                                          updateKinematics);
  cache.stB.E = CalcBodyWorldOrientation(model,Q,bodyIds[1],updateKinematics
                                         ).transpose()*bodyFrames[1].E;

  constraintForcesUpd.resize(2);
  constraintForcesUpd[0].setZero();
  constraintForcesUpd[1].setZero();


  //Using Eqn. 8.30 of Featherstone. Note that this force is resolved in the
  //root frame.
  cache.svecB.setZero();
  for(unsigned int i=0; i<sizeOfConstraint;++i){
    cache.svecA =  cache.stA.apply(T[i]);
    cache.svecB += cache.svecA*LagMultSys[rowInSystem+i];
  }

  constraintBodiesUpd.resize(2);
  constraintBodyFramesUpd.resize(2);

  if(resolveAllInRootFrame){
    constraintBodiesUpd[0] = 0;
    constraintBodiesUpd[1] = 0;

    //These forces are returned in the coordinates of the
    //root frame but w.r.t. the respective points of the constaint
    constraintBodyFramesUpd[0].r = cache.stA.r;
    constraintBodyFramesUpd[0].E.Identity();

    constraintBodyFramesUpd[1].r = cache.stB.r;
    constraintBodyFramesUpd[1].E.Identity();

    //The forces applied to the successor body are equal and opposite
    constraintForcesUpd[0] = -cache.svecB;
    constraintForcesUpd[1] = cache.svecB;

  }else{

    constraintBodiesUpd     = bodyIds;
    constraintBodyFramesUpd = bodyFrames;

    constraintForcesUpd[0].block(0,0,3,1) = -cache.stA.E.transpose()
                                              *cache.svecB.block(0,0,3,1);
    constraintForcesUpd[0].block(3,0,3,1) = -cache.stA.E.transpose()
                                              *cache.svecB.block(3,0,3,1);


    constraintForcesUpd[1].block(0,0,3,1) = cache.stB.E.transpose()
                                              *cache.svecB.block(0,0,3,1);
    constraintForcesUpd[1].block(3,0,3,1) = cache.stB.E.transpose()
                                              *cache.svecB.block(3,0,3,1);



  }



}